

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  SaveBlock save;
  LoadBlock load_;
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  time_t tVar4;
  Link *l;
  int *b;
  ostream *poVar5;
  IncomingQueues *this_00;
  uint uVar6;
  size_t i;
  ulong uVar7;
  int iVar8;
  undefined4 uStack_1c38;
  int nblocks;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1c30;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1c28;
  undefined4 uStack_1c20;
  int local_1c1c;
  environment env;
  undefined4 local_1c14;
  communicator world;
  _Any_data local_1bf8;
  code *local_1be8;
  code *local_1be0;
  ulong local_1bd0;
  ContiguousAssigner assigner;
  Skip local_1bb8;
  code *local_1b98 [2];
  code *local_1b88;
  code *local_1b80;
  code *local_1b78 [2];
  code *local_1b68;
  code *local_1b60;
  code *local_1b58 [2];
  code *local_1b48;
  code *local_1b40;
  code *local_1b38 [2];
  code *local_1b28;
  code *local_1b20;
  vector<int,_std::allocator<int>_> gids;
  communicator local_1b00;
  shared_ptr<diy::spd::logger> log;
  vector<int,_std::allocator<int>_> incoming_gids;
  SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip> local_1a50;
  string log_level;
  _Vector_base<int,_std::allocator<int>_> local_1a18;
  _Vector_base<int,_std::allocator<int>_> local_19f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19d0;
  _Any_data local_19c8;
  code *local_19b8;
  code *local_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  code *local_1998;
  code *local_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  code *local_1978;
  code *local_1970;
  Options ops;
  string local_1928 [32];
  RegularMergePartners merge_partners;
  _Bvector_base<std::allocator<bool>_> local_18b8;
  _Bvector_base<std::allocator<bool>_> local_1888;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  FileStorage storage;
  _Any_data local_16c8;
  code *local_16b8;
  code *local_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  code *local_1698;
  code *local_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  code *local_1670;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  nblocks = world.size_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_level,"info",(allocator<char> *)&master);
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"blocks",(allocator<char> *)local_19c8._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&decomposer,"number of blocks",(allocator<char> *)&merge_partners);
  opts::Option<int>((opts *)&local_1c28,'b',(string *)&master,&nblocks,(string *)&decomposer);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1c28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incoming_gids,"log",(allocator<char> *)local_1bf8._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage,"log level",(allocator<char> *)&local_1bb8);
  opts::Option<std::__cxx11::string>
            ((opts *)&local_1c30,'l',(string *)&incoming_gids,&log_level,(string *)&storage);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1c30);
  if (local_1c30._M_head_impl != (BasicOption *)0x0) {
    (*(local_1c30._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1c30._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&storage);
  std::__cxx11::string::~string((string *)&incoming_gids);
  if (local_1c28._M_head_impl != (BasicOption *)0x0) {
    (*(local_1c28._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1c28._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&decomposer);
  std::__cxx11::string::~string((string *)&master);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if (bVar1) {
    std::__cxx11::string::string(local_1928,(string *)&log_level);
    std::make_shared<diy::spd::logger>();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_19d0);
    std::__cxx11::string::~string(local_1928);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&master,"./DIY.XXXXXX",(allocator<char> *)&decomposer);
    diy::FileStorage::FileStorage(&storage,(string *)&master);
    std::__cxx11::string::~string((string *)&master);
    local_1b00.comm_.data = world.comm_.data;
    local_1b00.owner_ = false;
    local_1b38[1] = (code *)0x0;
    local_1b38[0] = create_block;
    local_1b20 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_1b28 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_1b58[1] = (code *)0x0;
    local_1b58[0] = destroy_block;
    local_1b40 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_1b78[1] = (code *)0x0;
    local_1b48 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_1b78[0] = save_block;
    local_1b60 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1b98[1] = (code *)0x0;
    local_1b68 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    local_1b98[0] = load_block;
    local_1b80 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1b88 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    puVar3 = (undefined8 *)operator_new(0x10);
    *puVar3 = &PTR_unload_incoming_0014f218;
    puVar3[1] = 0x1000;
    save.super__Function_base._M_functor._8_8_ = local_1b98;
    save.super__Function_base._M_functor._M_unused._M_object = local_1b78;
    save.super__Function_base._M_manager = (_Manager_type)puVar3;
    save._M_invoker._0_4_ = uStack_1c38;
    save._M_invoker._4_4_ = nblocks;
    load_.super__Function_base._M_functor._8_8_ = local_1c28._M_head_impl;
    load_.super__Function_base._M_functor._M_unused._M_object = local_1c30._M_head_impl;
    load_.super__Function_base._M_manager._0_4_ = uStack_1c20;
    load_.super__Function_base._M_manager._4_4_ = local_1c1c;
    load_._M_invoker._0_4_ = env.provided_threading;
    load_._M_invoker._4_4_ = local_1c14;
    diy::Master::Master(&master,&local_1b00,2,-1,(CreateBlock *)local_1b38,
                        (DestroyBlock *)local_1b58,&storage.super_ExternalStorage,save,load_,
                        (QueuePolicy *)world.comm_.data);
    std::_Function_base::~_Function_base((_Function_base *)local_1b98);
    std::_Function_base::~_Function_base((_Function_base *)local_1b78);
    std::_Function_base::~_Function_base((_Function_base *)local_1b58);
    std::_Function_base::~_Function_base((_Function_base *)local_1b38);
    diy::mpi::communicator::~communicator(&local_1b00);
    tVar4 = time((time_t *)0x0);
    srand((int)tVar4 + world.rank_);
    assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
    assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014f270;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::ContiguousAssigner::local_gids(&assigner,world.rank_,&gids);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      iVar8 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar7];
      l = (Link *)operator_new(0x20);
      (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0014f2f0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar8 < nblocks + -1) {
        decomposer.dim = iVar8 + 1;
        iVar2 = diy::ContiguousAssigner::rank(&assigner,iVar8 + 1);
        decomposer._4_4_ = iVar2;
        std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
                  (&l->neighbors_,(value_type *)&decomposer);
      }
      if (0 < iVar8) {
        decomposer.dim = iVar8 + -1;
        iVar2 = diy::ContiguousAssigner::rank(&assigner,iVar8 + -1);
        decomposer._4_4_ = iVar2;
        std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
                  (&l->neighbors_,(value_type *)&decomposer);
      }
      b = (int *)operator_new(0x14);
      iVar2 = rand();
      *b = iVar2 % 10 + 1;
      b[1] = 0;
      b[2] = 0;
      b[3] = 0;
      b[4] = 0;
      diy::Master::add(&master,iVar8,b,l);
    }
    decomposer._0_8_ = bounce;
    local_16c8._M_unused._M_object = (void *)0x0;
    local_16c8._8_8_ = 0;
    local_16b0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_16b8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_16a8 = 0;
    uStack_16a0 = 0;
    local_1690 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1698 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1688 = 0;
    uStack_1680 = 0;
    local_1670 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1678 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::iexchange<bool(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_bool_Block_ptr_ProxyWithLink_ptr **)&decomposer,
               (MemoryManagement *)&local_16c8);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_16c8);
    decomposer.dim = world.rank_;
    fmt::v7::print<char[28],int,char>((char (*) [28])"[{}]: Checking correctness\n",&decomposer.dim)
    ;
    diy::interval((DiscreteBounds *)&incoming_gids,0,nblocks + -1);
    local_1888._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_1888._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1888._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_1888._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_1888._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1888._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_1888._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_18b8._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_18b8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_18b8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_18b8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_18b8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_18b8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_18b8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_19f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_19f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_19f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a18._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a18._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a18._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
              (&decomposer,1,(Bounds *)&incoming_gids,nblocks,(BoolVector *)&local_1888,
               (BoolVector *)&local_18b8,(CoordinateVector *)&local_19f8,
               (DivisionsVector *)&local_1a18);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1a18);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_19f8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_18b8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_1888);
    diy::Bounds<int>::~Bounds((Bounds<int> *)&incoming_gids);
    diy::RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
              (&merge_partners.super_RegularPartners,&decomposer,2,false);
    std::make_shared<diy::spd::logger>();
    uVar7 = 0;
    while( true ) {
      iVar8 = (int)uVar7;
      if ((ulong)((long)merge_partners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)merge_partners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar7) break;
      local_1bf8._M_unused._M_object = (void *)0x0;
      local_1bf8._8_8_ = 0;
      local_1be0 = std::
                   _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                   ::_M_invoke;
      local_1be8 = std::
                   _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                   ::_M_manager;
      diy::detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
                ((ReductionFunctor<Block,_diy::RegularMergePartners> *)&incoming_gids,iVar8,
                 (Callback *)&local_1bf8,
                 (RegularMergePartners *)&merge_partners.super_RegularPartners,(Assigner *)&assigner
                );
      local_1a50.round = iVar8;
      local_1a50.partners = (RegularMergePartners *)&merge_partners.super_RegularPartners;
      std::function<bool(int,diy::Master_const&)>::
      function<diy::detail::SkipInactiveOr<diy::RegularMergePartners,diy::detail::ReduceNeverSkip>,void>
                ((function<bool(int,diy::Master_const&)> *)&local_1bb8,&local_1a50);
      diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
                (&master,(ReductionFunctor<Block,_diy::RegularMergePartners> *)&incoming_gids,
                 &local_1bb8);
      std::_Function_base::~_Function_base(&local_1bb8.super__Function_base);
      diy::detail::ReductionFunctor<Block,_diy::RegularMergePartners>::~ReductionFunctor
                ((ReductionFunctor<Block,_diy::RegularMergePartners> *)&incoming_gids);
      std::_Function_base::~_Function_base((_Function_base *)&local_1bf8);
      diy::Master::execute(&master);
      local_1c1c = 0;
      local_1bd0 = uVar7;
      for (uVar6 = 0;
          uVar6 < (uint)((ulong)((long)master.blocks_.elements_.
                                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)master.blocks_.elements_.
                                      super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3); uVar6 = uVar6 + 1) {
        bVar1 = diy::RegularMergePartners::active
                          ((RegularMergePartners *)&merge_partners.super_RegularPartners,iVar8 + 1U,
                           master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar6],&master);
        if (bVar1) {
          incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          diy::RegularPartners::fill
                    (&merge_partners.super_RegularPartners,(int)local_1bd0,
                     master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar6],&incoming_gids);
          uVar7 = (long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          this_00 = diy::Master::incoming
                              (&master,master.gids_.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[(int)uVar6]);
          diy::
          concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
          ::clear(this_00);
          local_1c1c = local_1c1c + (int)(uVar7 >> 2);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&incoming_gids.super__Vector_base<int,_std::allocator<int>_>);
        }
      }
      master.expected_ = local_1c1c;
      local_19c8._M_unused._M_object = (void *)0x0;
      local_19c8._8_8_ = 0;
      local_19b0 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
      local_19b8 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_manager;
      local_19a8 = 0;
      uStack_19a0 = 0;
      local_1990 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
      local_1998 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_manager;
      local_1988 = 0;
      uStack_1980 = 0;
      local_1970 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
      local_1978 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_manager;
      diy::Master::flush(&master,false,(MemoryManagement *)&local_19c8);
      diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_19c8);
      uVar7 = (ulong)(iVar8 + 1U);
    }
    local_1bf8._M_unused._M_object = (void *)0x0;
    local_1bf8._8_8_ = 0;
    local_1be0 = std::
                 _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                 ::_M_invoke;
    local_1be8 = std::
                 _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                 ::_M_manager;
    diy::detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
              ((ReductionFunctor<Block,_diy::RegularMergePartners> *)&incoming_gids,iVar8,
               (Callback *)&local_1bf8,(RegularMergePartners *)&merge_partners.super_RegularPartners
               ,(Assigner *)&assigner);
    local_1a50.round = iVar8;
    local_1a50.partners = (RegularMergePartners *)&merge_partners.super_RegularPartners;
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::RegularMergePartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool(int,diy::Master_const&)> *)&local_1bb8,&local_1a50);
    diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
              (&master,(ReductionFunctor<Block,_diy::RegularMergePartners> *)&incoming_gids,
               &local_1bb8);
    std::_Function_base::~_Function_base(&local_1bb8.super__Function_base);
    diy::detail::ReductionFunctor<Block,_diy::RegularMergePartners>::~ReductionFunctor
              ((ReductionFunctor<Block,_diy::RegularMergePartners> *)&incoming_gids);
    std::_Function_base::~_Function_base((_Function_base *)&local_1bf8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&log.super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    diy::RegularPartners::~RegularPartners(&merge_partners.super_RegularPartners);
    diy::RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&decomposer);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&gids.super__Vector_base<int,_std::allocator<int>_>);
    diy::Master::~Master(&master);
    diy::FileStorage::~FileStorage(&storage);
    iVar8 = 0;
  }
  else {
    iVar8 = 1;
    if (world.rank_ == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar5 = std::operator<<(poVar5,*argv);
      std::operator<<(poVar5," [OPTIONS]\n");
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  std::__cxx11::string::~string((string *)&log_level);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar8;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;

    // get command line arguments
    int         nblocks     = world.size();
    std::string log_level   = "info";
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  nblocks,        "number of blocks")
        >> Option('l', "log",     log_level,      "log level")
    ;
    if (!ops.parse(argc,argv))
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << ops;
        }
        return 1;
    }

    diy::create_logger(log_level);

    diy::FileStorage          storage("./DIY.XXXXXX");

    diy::Master               master(world,
                                     2,
                                     -1,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    srand(static_cast<unsigned int>(time(NULL) + world.rank()));

    diy::ContiguousAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (size_t i = 0; i < gids.size(); ++i)   // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*   link = new diy::Link;   // link is this block's neighborhood
        diy::BlockID neighbor;               // one neighbor in the neighborhood
        if (gid < nblocks - 1)               // all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        master.add(gid, new Block(1 + rand() % 10), link);    // add the current local block to the master
    }

    // dequeue, enqueue, exchange all in one nonblocking routine
    master.iexchange(&bounce);

    // alternatively, can hold small messages to reduce communication frequency
    // TODO: add this option to the test once we decide we will keep it
//     master.iexchange(&bounce, 16, 100);

    fmt::print("[{}]: Checking correctness\n", world.rank());

    // check correctness: number of finished particles and hops matches the expected numbers
    diy::RegularDecomposer<diy::DiscreteBounds> decomposer(1, diy::interval(0, nblocks-1), nblocks);
    diy::RegularMergePartners  merge_partners(decomposer, 2, false);
    diy::reduce(master, assigner, merge_partners,
                [](Block*                           b,
                   const diy::ReduceProxy&          rp,
                   const diy::RegularMergePartners&)
                {
                    fmt::print("[{}]: round = {}, entered\n", rp.gid(), rp.round());

                    // step 1: dequeue
                    for (int i = 0; i < rp.in_link().size(); ++i)
                    {
                        int nbr_gid = rp.in_link().target(i).gid;
                        if (nbr_gid == rp.gid())
                            continue;

                        int ep; rp.dequeue(nbr_gid, ep);    b->expected_particles   += ep;
                        int eh; rp.dequeue(nbr_gid, eh);    b->expected_hops        += eh;
                        int fp; rp.dequeue(nbr_gid, fp);    b->finished_particles   += fp;
                        int fh; rp.dequeue(nbr_gid, fh);    b->finished_hops        += fh;
                    }

                    // step 2: enqueue
                    for (int i = 0; i < rp.out_link().size(); ++i)    // redundant since size should equal to 1
                    {
                        // only send to root of group, but not self
                        if (rp.out_link().target(i).gid != rp.gid())
                        {
                            rp.enqueue(rp.out_link().target(i), b->expected_particles);
                            rp.enqueue(rp.out_link().target(i), b->expected_hops);
                            rp.enqueue(rp.out_link().target(i), b->finished_particles);
                            rp.enqueue(rp.out_link().target(i), b->finished_hops);
                        }
                    }

                    if (rp.out_link().size() == 0 && rp.gid() == 0)     // tip of the reduction, check correctness
                    {
                        fmt::print("[{}]: checking correctness, {} vs {}, {} vs {}\n",
                                   rp.gid(),
                                   b->expected_particles, b->finished_particles,
                                   b->expected_hops, b->finished_hops);

                        if (b->expected_particles != b->finished_particles)
                        {
                           fmt::print(stderr, "In block {}, all_expected_particles != all_finished_particles: {} != {}\n",
                                              rp.gid(), b->expected_particles, b->finished_particles);
                           std::abort();
                        }
                        if (b->expected_hops != b->finished_hops)
                        {
                           fmt::print(stderr, "In block {}, all_expected_hops != all_finished_hops: {} != {}\n",
                                              rp.gid(), b->expected_hops, b->finished_hops);
                           std::abort();
                        }
                    }
                    fmt::print("[{}]: round = {}, leaving\n", rp.gid(), rp.round());
                });
}